

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O0

TraceSubResult *
geometrycentral::surface::anon_unknown_2::traceInFaceBarycentric
          (IntrinsicGeometryInterface *geom,Face face,Vector3 startPoint,Vector3 vecBary,
          Vector2 vecCartesianDir,double vecCartesianLen,array<bool,_3UL> edgeIsHittable,
          TraceOptions *traceOptions)

{
  Vector3 baryCoords;
  Face f;
  Face f_00;
  Edge e;
  Edge e_00;
  Edge e_01;
  Edge e_02;
  Edge e_03;
  Halfedge he;
  Vector3 faceCoords_;
  Vector3 faceCoords__00;
  Face face_00;
  bool bVar1;
  double *pdVar2;
  runtime_error *prVar3;
  double dVar4;
  reference pvVar5;
  logic_error *this;
  reference this_00;
  reference v;
  bool *pbVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  TraceSubResult *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  double in_XMM0_Qa;
  double dVar7;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  SurfacePoint *in_stack_00000010;
  ParentMeshT *in_stack_00000018;
  TraceSubResult *result;
  Vector2 remainingDirInHalfedge;
  Vector2 crossingEdgeVec;
  double lenRemaining;
  double tCross;
  Vector3 endPointOnEdge;
  double tRayThis;
  double tRayThisRaw;
  int i;
  Halfedge currHe;
  int iOppVertEnd;
  Halfedge crossHe;
  double tRay;
  Vector3 endPoint;
  Vector3 triangleLengths;
  array<geometrycentral::Vector2,_3UL> vertexCoords;
  Face *in_stack_fffffffffffffb90;
  TraceSubResult *this_01;
  ParentMeshT *v_00;
  MeshData<geometrycentral::surface::Edge,_double> *in_stack_fffffffffffffba0;
  double in_stack_fffffffffffffba8;
  undefined6 in_stack_fffffffffffffbb0;
  byte in_stack_fffffffffffffbb6;
  undefined1 in_stack_fffffffffffffbb7;
  byte bVar8;
  byte bVar9;
  size_t in_stack_fffffffffffffbb8;
  double in_stack_fffffffffffffbc0;
  double dVar10;
  IntrinsicGeometryInterface *in_stack_fffffffffffffbe0;
  ParentMeshT *in_stack_fffffffffffffbe8;
  TraceSubResult *pTVar11;
  undefined1 local_3b8 [88];
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_360;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_350;
  Vector2 local_340;
  Vector2 local_330;
  Vector2 local_320;
  double local_310;
  double local_308;
  Vector3 local_300;
  Vector3 local_2e8 [2];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [88];
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_250;
  double local_240;
  double local_238;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_230;
  int local_21c;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_218;
  int local_204;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_200;
  double local_1f0;
  double local_1e8;
  TraceSubResult *local_1e0;
  ParentMeshT *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [88];
  double local_168;
  TraceSubResult *local_160;
  ParentMeshT *local_158;
  Vector3 local_150;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_128;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_118;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_108;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_f8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_d8;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_c8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_b8;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_a8;
  double local_98;
  double local_90;
  double local_88;
  long local_40;
  double local_38;
  undefined2 local_23;
  undefined1 local_21;
  double local_20;
  double local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_21 = (undefined1)((uint)in_R8D >> 0x10);
  local_23 = (undefined2)in_R8D;
  face_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       (size_t)in_RDI;
  face_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
       = in_stack_fffffffffffffbe8;
  pTVar11 = in_RDI;
  local_40 = in_R9;
  local_38 = in_XMM2_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_RDX;
  local_8 = in_RCX;
  vertexCoordinatesInTriangle(in_stack_fffffffffffffbe0,face_00);
  local_b8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             Face::halfedge(in_stack_fffffffffffffb90);
  local_a8 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffb90);
  e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _0_6_ = in_stack_fffffffffffffbb0;
  e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)in_stack_fffffffffffffba8;
  e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _6_1_ = in_stack_fffffffffffffbb6;
  e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _7_1_ = in_stack_fffffffffffffbb7;
  pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                     (in_stack_fffffffffffffba0,e_00);
  local_98 = *pdVar2;
  local_e8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             Face::halfedge(in_stack_fffffffffffffb90);
  local_d8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::next((Halfedge *)in_stack_fffffffffffffb90);
  local_c8 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffb90);
  e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _0_6_ = in_stack_fffffffffffffbb0;
  e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)in_stack_fffffffffffffba8;
  e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _6_1_ = in_stack_fffffffffffffbb6;
  e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _7_1_ = in_stack_fffffffffffffbb7;
  pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                     (in_stack_fffffffffffffba0,e_01);
  local_90 = *pdVar2;
  local_128 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Face::halfedge(in_stack_fffffffffffffb90);
  local_118 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Halfedge::next((Halfedge *)in_stack_fffffffffffffb90);
  local_108 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Halfedge::next((Halfedge *)in_stack_fffffffffffffb90);
  local_f8 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffb90);
  e_02.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _0_6_ = in_stack_fffffffffffffbb0;
  e_02.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)in_stack_fffffffffffffba8;
  e_02.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _6_1_ = in_stack_fffffffffffffbb6;
  e_02.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind.
  _7_1_ = in_stack_fffffffffffffbb7;
  pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                     (in_stack_fffffffffffffba0,e_02);
  local_88 = *pdVar2;
  dVar7 = geometrycentral::sum((Vector3 *)&stack0x00000008);
  if ((dVar7 < 0.5) && ((*(byte *)(local_40 + 1) & 1) != 0)) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar3,"bad bary point");
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  Vector3::operator+(&local_150,(Vector3 *)&stack0x00000008,(Vector3 *)&stack0x00000020);
  local_168 = local_150.x;
  local_160 = (TraceSubResult *)local_150.y;
  local_158 = (ParentMeshT *)local_150.z;
  baryCoords.y = local_150.y;
  baryCoords.x = local_150.x;
  baryCoords.z = local_150.z;
  dVar7 = local_150.x;
  this_01 = (TraceSubResult *)local_150.y;
  v_00 = (ParentMeshT *)local_150.z;
  bVar1 = isInsideTriangle(baryCoords);
  if (bVar1) {
    TraceSubResult::TraceSubResult(this_01);
    pTVar11->terminated = true;
    local_1d0 = local_10;
    local_1c8 = local_8;
    local_1e8 = local_150.x;
    local_1e0 = (TraceSubResult *)local_150.y;
    local_1d8 = (ParentMeshT *)local_150.z;
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffba0;
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)local_150.z;
    faceCoords_.x._6_1_ = in_stack_fffffffffffffbb6;
    faceCoords_.x._0_6_ = in_stack_fffffffffffffbb0;
    faceCoords_.x._7_1_ = in_stack_fffffffffffffbb7;
    faceCoords_.y = (double)in_stack_fffffffffffffbb8;
    faceCoords_.z = in_stack_fffffffffffffbc0;
    SurfacePoint::SurfacePoint((SurfacePoint *)local_150.y,f,faceCoords_);
    memcpy(&pTVar11->endPoint,local_1c0,0x58);
    (pTVar11->incomingDirToPoint).x = local_20;
    (pTVar11->incomingDirToPoint).y = local_18;
  }
  else {
    local_1f0 = ::std::numeric_limits<double>::infinity();
    Halfedge::Halfedge((Halfedge *)0x2fb2f0);
    local_204 = -0x309;
    local_218 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Face::halfedge((Face *)this_01);
    for (local_21c = 0; local_21c < 3; local_21c = local_21c + 1) {
      local_230 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)this_01);
      local_218 = local_230;
      pdVar2 = Vector3::operator[]((Vector3 *)&stack0x00000008,local_21c);
      dVar4 = -*pdVar2;
      pdVar2 = Vector3::operator[]((Vector3 *)&stack0x00000020,local_21c);
      local_238 = dVar4 / *pdVar2;
      local_240 = clamp<double>(local_238,0.0,0.999999999);
      pvVar5 = ::std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)this_01,(size_type)dVar7);
      if ((((*pvVar5 & 1U) != 0) &&
          (pdVar2 = Vector3::operator[]((Vector3 *)&stack0x00000020,local_21c), *pdVar2 < 0.0)) &&
         (local_238 < local_1f0)) {
        local_1f0 = local_238;
        local_200.mesh = local_218.mesh;
        local_200.ind = local_218.ind;
        local_204 = local_21c;
      }
    }
    local_1f0 = clamp<double>(local_1f0,0.0,0.999999999);
    Halfedge::Halfedge((Halfedge *)0x2fb4d2);
    bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator==(&local_200,&local_250);
    if (bVar1) {
      if ((*(byte *)(local_40 + 1) & 1) != 0) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error
                  (this,"no halfedge intersection was selected, precondition problem?");
        __cxa_throw(this,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      TraceSubResult::TraceSubResult(this_01);
      pTVar11->terminated = true;
      local_2b8 = local_10;
      local_2b0 = local_8;
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
           = (size_t)in_stack_fffffffffffffba0;
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_00000018;
      faceCoords__00.x._6_1_ = in_stack_fffffffffffffbb6;
      faceCoords__00.x._0_6_ = in_stack_fffffffffffffbb0;
      faceCoords__00.x._7_1_ = in_stack_fffffffffffffbb7;
      faceCoords__00.y = (double)in_stack_fffffffffffffbb8;
      faceCoords__00.z = in_stack_fffffffffffffbc0;
      SurfacePoint::SurfacePoint(in_stack_00000010,f_00,faceCoords__00);
      memcpy(&pTVar11->endPoint,local_2a8,0x58);
      (pTVar11->incomingDirToPoint).x = local_20;
      (pTVar11->incomingDirToPoint).y = local_18;
    }
    else {
      geometrycentral::operator*(&local_300,local_1f0,(Vector3 *)&stack0x00000020);
      Vector3::operator+(local_2e8,(Vector3 *)&stack0x00000008,&local_300);
      pdVar2 = Vector3::operator[](local_2e8,(local_204 + 2) % 3);
      dVar4 = *pdVar2;
      pdVar2 = Vector3::operator[](local_2e8,(local_204 + 1) % 3);
      dVar10 = *pdVar2;
      pdVar2 = Vector3::operator[](local_2e8,(local_204 + 2) % 3);
      local_308 = dVar4 / (dVar10 + *pdVar2);
      local_308 = clamp<double>(local_308,0.0,1.0);
      local_310 = (1.0 - local_1f0) * local_38;
      this_00 = ::std::array<geometrycentral::Vector2,_3UL>::operator[]
                          ((array<geometrycentral::Vector2,_3UL> *)this_01,(size_type)dVar7);
      v = ::std::array<geometrycentral::Vector2,_3UL>::operator[]
                    ((array<geometrycentral::Vector2,_3UL> *)this_01,(size_type)dVar7);
      local_320 = Vector2::operator-(this_00,v);
      local_340 = Vector2::normalize((Vector2 *)this_01);
      local_330 = Vector2::operator/((Vector2 *)in_stack_fffffffffffffba0,(Vector2 *)v_00);
      bVar1 = isfinite((Vector2 *)0x2fb807);
      if ((!bVar1) && ((*(byte *)(local_40 + 1) & 1) != 0)) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar3,"bad value transforming to new edge. is there a zero-length edge?");
        __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_350 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::twin((Halfedge *)this_01);
      bVar1 = Halfedge::isInterior((Halfedge *)0x2fb8a3);
      bVar8 = 1;
      bVar9 = bVar8;
      if ((bVar1) &&
         (in_stack_fffffffffffffbb6 = 0, bVar9 = in_stack_fffffffffffffbb6,
         *(long *)(local_40 + 8) != 0)) {
        in_stack_fffffffffffffba8 = *(double *)(local_40 + 8);
        local_360 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                    Halfedge::edge((Halfedge *)this_01);
        e_03.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._0_6_ = in_stack_fffffffffffffbb0;
        e_03.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)in_stack_fffffffffffffba8;
        e_03.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._6_1_ = in_stack_fffffffffffffbb6;
        e_03.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind._7_1_ = bVar8;
        pbVar6 = MeshData<geometrycentral::surface::Edge,_bool>::operator[]
                           ((MeshData<geometrycentral::surface::Edge,_bool> *)
                            in_stack_fffffffffffffba0,e_03);
        in_stack_fffffffffffffbb6 = *pbVar6;
        bVar9 = in_stack_fffffffffffffbb6;
      }
      if ((bVar9 & 1) == 0) {
        TraceSubResult::TraceSubResult(this_01);
        pTVar11->terminated = false;
        (pTVar11->crossHe).
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_200.mesh;
        (pTVar11->crossHe).
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = local_200.ind;
        pTVar11->tCross = local_308;
        (pTVar11->traceVectorInHalfedgeDir).x = local_330.x;
        (pTVar11->traceVectorInHalfedgeDir).y = local_330.y;
        pTVar11->traceVectorInHalfedgeLen = local_310;
      }
      else {
        TraceSubResult::TraceSubResult(this_01);
        pTVar11->terminated = true;
        Halfedge::edge((Halfedge *)this_01);
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh._6_1_ = in_stack_fffffffffffffbb6;
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh._0_6_ = in_stack_fffffffffffffbb0;
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh._7_1_ = bVar9;
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        ind = in_stack_fffffffffffffbb8;
        convertTToEdge(he,in_stack_fffffffffffffba8);
        e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
             (size_t)in_stack_fffffffffffffba0;
        e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
             = v_00;
        SurfacePoint::SurfacePoint((SurfacePoint *)this_01,e,dVar7);
        memcpy(&pTVar11->endPoint,local_3b8,0x58);
        (pTVar11->incomingDirToPoint).x = local_330.x;
        (pTVar11->incomingDirToPoint).y = local_330.y;
      }
    }
  }
  return in_RDI;
}

Assistant:

inline TraceSubResult traceInFaceBarycentric(IntrinsicGeometryInterface& geom, Face face, Vector3 startPoint,
                                             Vector3 vecBary, Vector2 vecCartesianDir, double vecCartesianLen,
                                             std::array<bool, 3> edgeIsHittable, const TraceOptions& traceOptions) {

  // Gather values
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, face);
  Vector3 triangleLengths{geom.edgeLengths[face.halfedge().edge()], geom.edgeLengths[face.halfedge().next().edge()],
                          geom.edgeLengths[face.halfedge().next().next().edge()]};

  if (sum(startPoint) < 0.5) {
    if (TRACE_PRINT) {
      cout << "  bad bary point: " << startPoint << endl;
    }
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad bary point");
    }
  }

  if (TRACE_PRINT) {
    cout << "  general trace in face: " << endl;
    cout << "  face: " << face << " startPoint " << startPoint << " vecBary = " << vecBary << " vecCartesian "
         << vecCartesianDir << " " << vecCartesianLen << endl;
  }

  if (TRACE_PRINT) {
    cout << "  vec bary  = " << vecBary << endl;
    cout << "  reconvert = " << cartesianVectorToBarycentric(vertexCoords, vecCartesianDir) * vecCartesianLen << endl;
  }

  // Test if the vector ends in the triangle
  Vector3 endPoint = startPoint + vecBary;
  if (TRACE_PRINT) {
    cout << "    endpoint: " << endPoint << endl;
  }

  /*
  if (isInsideTriangle(endPoint)) {
    // Fancy test if ending on edges
    // (to detect when we're within eps of edge)
    bool foundEpsEdge = false;
    if (traceOptions.allowEndOnEdge) {
      double A = 0.5 * cross(vertexCoords[1] - vertexCoords[0], vertexCoords[2] - vertexCoords[0]);
      Halfedge endHe = face.halfedge();
      for (int i = 0; i < 3; i++) {
        double dist = 2. * endPoint[i] * A / triangleLengths[i]; // perp distance to edge
        if (endPoint[i] > 0 && dist < traceOptions.allowEndOnEdgeEps) {
          // force the process below to hit this edge, let other logic proceed
          edgeIsHittable[i] = true;
          edgeIsHittable[(i + 1) % 3] = false;
          edgeIsHittable[(i + 2) % 3] = false;
          foundEpsEdge = true;
          break;
        }
      }
    }
    // Simple test if not ending on edges
    if (!foundEpsEdge) {
      // The trace ended! Call it a day.
      TraceSubResult result;
      result.terminated = true;
      result.endPoint = SurfacePoint(face, endPoint);
      result.incomingDirToPoint = vecCartesian;
      return result;
    }
  }
  */

  if (isInsideTriangle(endPoint)) {
    // The trace ended! Call it a day.
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, endPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }


  // The vector did not end in this triangle. Pick an appropriate point along some edge
  double tRay = std::numeric_limits<double>::infinity();
  Halfedge crossHe = Halfedge();
  int iOppVertEnd = -777;
  Halfedge currHe = face.halfedge();
  for (int i = 0; i < 3; i++) {
    currHe = currHe.next(); // always opposite the i'th vertex

    // Check the crossing
    double tRayThisRaw = -startPoint[i] / vecBary[i];
    double tRayThis = clamp(tRayThisRaw, 0., 1. - TRACE_EPS_LOOSE);

    if (TRACE_PRINT) {
      cout << "    considering intersection:" << endl;
      cout << std::boolalpha;
      cout << "      hittable[(i+1)%3]: " << edgeIsHittable[(i + 1) % 3] << endl;
      cout << "      vecBary[i]: " << vecBary[i] << endl;
      cout << "      startPoint[i]: " << startPoint[i] << endl;
      cout << "      tRayThisRaw: " << tRayThisRaw << endl;
      cout << "      tRayThis: " << tRayThis << endl;
    }


    if (!edgeIsHittable[(i + 1) % 3] || vecBary[i] >= 0) {
      // note should ALWAYS satisfy precondition that vecBary[i] is negative for at least one hittable edge.
      // if not, fix projection of inputs in caller
      continue;
    }

    if (tRayThisRaw < tRay) {
      // This is the new closest intersection
      tRay = tRayThisRaw;
      crossHe = currHe;
      iOppVertEnd = i;
    }
  }

  if (TRACE_PRINT) {
    cout << "    selected intersection:" << endl;
    cout << "      crossHe: " << crossHe << endl;
    cout << "      tRay: " << tRay << endl;
    cout << "      iOppVertEnd: " << iOppVertEnd << endl;
  }

  // Clamp to a sane range
  tRay = clamp(tRay, 0., 1. - TRACE_EPS_LOOSE);


  if (crossHe == Halfedge()) {
    if (traceOptions.errorOnProblem) {
      throw std::logic_error("no halfedge intersection was selected, precondition problem?");
    }
    if (TRACE_PRINT) {
      cout << "    PROBLEM PROBLEM NO INTERSECTION:" << endl;
    }

    // End immediately
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, startPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }

  // Compute some useful info about the endpoint
  Vector3 endPointOnEdge = startPoint + tRay * vecBary;
  double tCross = endPointOnEdge[(iOppVertEnd + 2) % 3] /
                  (endPointOnEdge[(iOppVertEnd + 1) % 3] + endPointOnEdge[(iOppVertEnd + 2) % 3]);
  if (TRACE_PRINT) {
    cout << "    end point on edge: " << endPointOnEdge << endl;
    cout << "    tCross raw: " << tCross << endl;
  }
  tCross = clamp(tCross, 0., 1.);

  // Rotate the vector in to the frame of crossHe and shorten it
  double lenRemaining = (1.0 - tRay) * vecCartesianLen;
  Vector2 crossingEdgeVec = (vertexCoords[(iOppVertEnd + 2) % 3] - vertexCoords[(iOppVertEnd + 1) % 3]);
  Vector2 remainingDirInHalfedge = vecCartesianDir / crossingEdgeVec.normalize();
  if (!isfinite(remainingDirInHalfedge)) {
    if (TRACE_PRINT) {
      cout << "    NON FINITE REMAINING TRACE" << endl;
      cout << "    lenRemaining = " << lenRemaining << endl;
      cout << "    crossingEdgeVec = " << crossingEdgeVec << endl;
      cout << "    remainingDirInHalfedge = " << remainingDirInHalfedge << endl;
    }

    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad value transforming to new edge. is there a zero-length edge?");
    }
  }


  // Stop tracing if we hit a boundary
  if (!crossHe.twin().isInterior() || (traceOptions.barrierEdges && (*traceOptions.barrierEdges)[crossHe.edge()])) {
    // Build the result
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(crossHe.edge(), convertTToEdge(crossHe, tCross));
    result.incomingDirToPoint = remainingDirInHalfedge;

    return result;
  }

  // Build the result
  TraceSubResult result;
  result.terminated = false;
  result.crossHe = crossHe;
  result.tCross = tCross;
  result.traceVectorInHalfedgeDir = remainingDirInHalfedge;
  result.traceVectorInHalfedgeLen = lenRemaining;
  return result;
}